

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::ComputeCoarseStiffness
          (TPZDohrSubstruct<std::complex<long_double>_> *this)

{
  int64_t newRows;
  TPZMatrix<std::complex<long_double>_> *pTVar1;
  complex<long_double> alpha;
  complex<long_double> beta;
  undefined6 uStack_de;
  undefined6 uStack_ce;
  undefined8 local_c8;
  undefined2 uStack_c0;
  undefined6 uStack_be;
  undefined8 local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  TPZFMatrix<std::complex<long_double>_> temp1;
  
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (&temp1,(long)this->fNEquations,(this->fCoarseIndex).fNElements);
  newRows = (this->fCoarseIndex).fNElements;
  TPZFMatrix<std::complex<long_double>_>::Resize(&this->fKCi,newRows,newRows);
  pTVar1 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar1,&this->fPhiC,&temp1,0);
  local_c8 = SUB108((longdouble)1,0);
  uStack_c0 = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
  local_b8 = SUB108((longdouble)0,0);
  uStack_b0 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
  beta._M_value._10_6_ = uStack_de;
  beta._M_value._8_2_ = uStack_b0;
  beta._M_value._26_6_ = uStack_ce;
  beta._M_value._24_2_ = uStack_b0;
  alpha._M_value._10_6_ = uStack_be;
  alpha._M_value._8_2_ = uStack_c0;
  alpha._M_value._26_6_ = uStack_ae;
  alpha._M_value._24_2_ = uStack_b0;
  alpha._M_value._0_8_ = local_c8;
  alpha._M_value._16_8_ = local_b8;
  beta._M_value._0_8_ = local_b8;
  beta._M_value._16_8_ = local_b8;
  TPZFMatrix<std::complex<long_double>_>::MultAdd
            (&this->fPhiC,&temp1,&temp1,&this->fKCi,alpha,beta,1);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&temp1);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeCoarseStiffness() {
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	fKCi.Resize(fCoarseIndex.NElements(),fCoarseIndex.NElements());
	fStiffness->Multiply(fPhiC,temp1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		temp1.Print("stiffness matrix times phi",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fPhiC.MultAdd(temp1,temp1,fKCi,1,0,1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		fKCi.Print("Coarse stiffness matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}